

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printThumbS4ImmOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint uVar3;
  MCOperand *op;
  int64_t iVar4;
  uint tmp;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  iVar4 = MCOperand_getImm(op);
  uVar3 = (int)iVar4 << 2;
  if (uVar3 < 10) {
    SStream_concat(O,"#%u",(ulong)uVar3);
  }
  else {
    SStream_concat(O,"#0x%x",(ulong)uVar3);
  }
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar1 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(uint *)(MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar3;
    pcVar2 = MI->flat_insn->detail;
    (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
  }
  return;
}

Assistant:

static void printThumbS4ImmOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned tmp = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum)) * 4;
	if (tmp > HEX_THRESHOLD)
		SStream_concat(O, "#0x%x", tmp);
	else
		SStream_concat(O, "#%u", tmp);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = tmp;
		MI->flat_insn->detail->arm.op_count++;
	}
}